

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADEC-CORE.cpp
# Opt level: O0

void bb_max_clq(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  bool bVar3;
  reference pvVar4;
  size_t sVar5;
  ulong uVar6;
  long lVar7;
  undefined8 *puVar8;
  undefined8 *puVar9;
  byte bVar10;
  undefined8 auStack_2538 [236];
  void *local_1dd8;
  int *local_1dd0;
  ulong local_1dc8;
  long local_1dc0;
  void *local_1db8;
  int *local_1db0;
  value_type local_1da8;
  int local_79c;
  Vset *pVStack_798;
  int v;
  Vset *nC;
  int i;
  void *local_30;
  int *color;
  int *U;
  Vset *pVStack_18;
  int sizeC;
  Vset *C;
  Vset *P;
  
  bVar10 = 0;
  bVar3 = KDefectiveMADEC::TimeIsUp(controller);
  if (bVar3) {
    std::stack<bb_content,_std::deque<bb_content,_std::allocator<bb_content>_>_>::pop(&bb_stack);
  }
  else {
    C = &std::stack<bb_content,_std::deque<bb_content,_std::allocator<bb_content>_>_>::top
                   (&bb_stack)->P;
    pvVar4 = std::stack<bb_content,_std::deque<bb_content,_std::allocator<bb_content>_>_>::top
                       (&bb_stack);
    pVStack_18 = &pvVar4->C;
    TREE_SIZE = TREE_SIZE + 1;
    sVar5 = std::bitset<15000UL>::count(pVStack_18);
    U._4_4_ = (int)sVar5;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)U._4_4_;
    uVar6 = SUB168(auVar1 * ZEXT816(4),0);
    if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
      uVar6 = 0xffffffffffffffff;
    }
    color = (int *)operator_new__(uVar6);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)U._4_4_;
    uVar6 = SUB168(auVar2 * ZEXT816(4),0);
    if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
      uVar6 = 0xffffffffffffffff;
    }
    local_30 = operator_new__(uVar6);
    memcpy(&stack0xfffffffffffff878,pVStack_18,0x758);
    local_1db0 = color;
    local_1db8 = local_30;
    puVar8 = (undefined8 *)&stack0xfffffffffffff878;
    puVar9 = auStack_2538;
    for (lVar7 = 0xeb; lVar7 != 0; lVar7 = lVar7 + -1) {
      *puVar9 = *puVar8;
      puVar8 = puVar8 + (ulong)bVar10 * -2 + 1;
      puVar9 = puVar9 + (ulong)bVar10 * -2 + 1;
    }
    bb_color(local_1db0,local_1db8);
    nC._4_4_ = U._4_4_;
    while (nC._4_4_ = nC._4_4_ + -1, -1 < nC._4_4_) {
      local_1dc0 = (long)*(int *)((long)local_30 + (long)nC._4_4_ * 4);
      sVar5 = std::bitset<15000UL>::count(C);
      if (local_1dc0 + sVar5 <= (ulong)(long)LB) break;
      pvVar4 = std::stack<bb_content,_std::deque<bb_content,_std::allocator<bb_content>_>_>::top
                         (&bb_stack);
      pVStack_798 = &pvVar4->nC;
      memcpy(pVStack_798,pVStack_18,0x758);
      local_79c = color[nC._4_4_];
      std::bitset<15000UL>::set(C,(long)local_79c,true);
      std::bitset<15000UL>::operator&=(pVStack_798,N + local_79c);
      local_1dc8 = (ulong)LB;
      sVar5 = std::bitset<15000UL>::count(C);
      if (local_1dc8 < sVar5) {
        sVar5 = std::bitset<15000UL>::count(C);
        LB = (int)sVar5;
        fprintf(_stderr,"new LB: %d @ MAX CLIQUE\n",sVar5 & 0xffffffff);
      }
      bVar3 = std::bitset<15000UL>::any(pVStack_798);
      if (bVar3) {
        memcpy(&local_1da8,C,0x758);
        memcpy(&local_1da8.C,pVStack_798,0x758);
        std::bitset<15000UL>::bitset(&local_1da8.nC);
        std::stack<bb_content,_std::deque<bb_content,_std::allocator<bb_content>_>_>::push
                  (&bb_stack,&local_1da8);
        bb_max_clq();
      }
      std::bitset<15000UL>::reset(C,(long)local_79c);
      std::bitset<15000UL>::reset(pVStack_18,(long)local_79c);
    }
    local_1dd0 = color;
    if (color != (int *)0x0) {
      operator_delete__(color);
    }
    local_1dd8 = local_30;
    if (local_30 != (void *)0x0) {
      operator_delete__(local_30);
    }
    std::stack<bb_content,_std::deque<bb_content,_std::allocator<bb_content>_>_>::pop(&bb_stack);
  }
  return;
}

Assistant:

void bb_max_clq() {
    if (controller -> TimeIsUp()) {
        bb_stack.pop();
        return;
    };
    Vset &P = bb_stack.top().P;
    Vset &C = bb_stack.top().C;

    ++TREE_SIZE;
    int sizeC = C.count();
    int *U = new int[sizeC];
    int *color = new int[sizeC];
    bb_color(C, U, color);
    for (int i = sizeC - 1; i >= 0; --i) {
        if (color[i] + P.count() <= LB) goto bb_finish;
        Vset &nC = bb_stack.top().nC;
        nC = C;
        int v = U[i];
        P.set(v); nC &= N[v];
        if (LB < P.count()) {
            LB = P.count();
            fprintf(stderr, "new LB: %d @ MAX CLIQUE\n", LB);
        }
        if (nC.any()) {
            bb_stack.push({P, nC, Vset()});
            bb_max_clq();
        }
        P.reset(v); C.reset(v);
    }

bb_finish:
    delete[] U;
    delete[] color;
    bb_stack.pop();
}